

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

int tokgetlin(tokcxdef *ctx,int dopound)

{
  ushort uVar1;
  lindef *plVar2;
  int iVar3;
  uchar *puVar4;
  ulong __n;
  ushort **ppuVar5;
  int in_ESI;
  tokcxdef *in_RDI;
  bool bVar6;
  int stat;
  int cnt;
  int i;
  int len_1;
  char *p_1;
  char *newp;
  size_t len;
  int done;
  uint rem;
  char *p;
  lindef *parent;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  byte *local_48;
  uint local_2c;
  uchar *local_28;
  
LAB_0011ecfd:
  do {
    while (iVar3 = (*in_RDI->tokcxlin->lingetp)(in_RDI->tokcxlin), iVar3 != 0) {
      if (in_RDI->tokcxlin->linpar == (lindef *)0x0) {
        if (in_RDI->tokcxifcnt != 0) {
          errlogf((errcxdef *)
                  CONCAT17(in_stack_ffffffffffffffa7,
                           CONCAT16(in_stack_ffffffffffffffa6,
                                    CONCAT15(in_stack_ffffffffffffffa5,
                                             CONCAT14(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0)))),
                  in_stack_ffffffffffffff98,0);
        }
        return 1;
      }
      plVar2 = in_RDI->tokcxlin->linpar;
      (*in_RDI->tokcxlin->linclsp)(in_RDI->tokcxlin);
      if (in_RDI->tokcxdbg == (dbgcxdef *)0x0) {
        free(in_RDI->tokcxlin);
      }
      in_RDI->tokcxlin = plVar2;
      if ((plVar2->linflg & 0x10) == 0) {
        in_RDI->tokcxflg = in_RDI->tokcxflg & 0xfffffffb;
      }
      else {
        in_RDI->tokcxflg = in_RDI->tokcxflg | 4;
      }
    }
    if ((in_RDI->tokcxlin->linflg & 2) == 0) {
      in_RDI->tokcxptr = in_RDI->tokcxlin->linbuf;
      in_RDI->tokcxlen = in_RDI->tokcxlin->linlen;
    }
    else {
      if (in_RDI->tokcxbuf == (char *)0x0) {
        puVar4 = mchalo((errcxdef *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                         CONCAT16(in_stack_ffffffffffffffa6,
                                                  CONCAT15(in_stack_ffffffffffffffa5,
                                                           CONCAT14(in_stack_ffffffffffffffa4,
                                                                    in_stack_ffffffffffffffa0)))));
        in_RDI->tokcxbuf = (char *)puVar4;
        in_RDI->tokcxbsz = 0x400;
      }
      in_RDI->tokcxlen = 0;
      bVar6 = false;
      local_28 = (uchar *)in_RDI->tokcxbuf;
      local_2c = (uint)in_RDI->tokcxbsz;
      do {
        if (bVar6) break;
        uVar1 = in_RDI->tokcxlin->linlen;
        __n = (ulong)uVar1;
        in_RDI->tokcxlen = in_RDI->tokcxlen + uVar1;
        bVar6 = (in_RDI->tokcxlin->linflg & 2) == 0;
        if ((ulong)local_2c < __n + 1) {
          if (0x8000 < in_RDI->tokcxbsz) {
            errsigf((errcxdef *)
                    CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0)))),
                    in_stack_ffffffffffffff98,0);
          }
          local_2c = local_2c + 0x1000;
          in_RDI->tokcxbsz = in_RDI->tokcxbsz + 0x1000;
          puVar4 = mchalo((errcxdef *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                           CONCAT16(in_stack_ffffffffffffffa6,
                                                    CONCAT15(in_stack_ffffffffffffffa5,
                                                             CONCAT14(in_stack_ffffffffffffffa4,
                                                                      in_stack_ffffffffffffffa0)))))
          ;
          memcpy(puVar4,in_RDI->tokcxbuf,(long)local_28 - (long)in_RDI->tokcxbuf);
          local_28 = puVar4 + ((long)local_28 - (long)in_RDI->tokcxbuf);
          free(in_RDI->tokcxbuf);
          in_RDI->tokcxbuf = (char *)puVar4;
        }
        memcpy(local_28,in_RDI->tokcxlin->linbuf,__n);
        local_28 = local_28 + __n;
        local_2c = local_2c - uVar1;
      } while ((bVar6) || (iVar3 = (*in_RDI->tokcxlin->lingetp)(in_RDI->tokcxlin), iVar3 == 0));
      *local_28 = '\0';
      in_RDI->tokcxptr = in_RDI->tokcxbuf;
    }
    if ((((in_ESI == 0) || (in_RDI->tokcxlen == 0)) || (*in_RDI->tokcxptr != '#')) ||
       ((in_RDI->tokcxlin->linflg & 8) != 0)) {
      if ((in_RDI->tokcxifcnt == 0) ||
         ((in_stack_ffffffffffffffa0 = in_RDI->tokcxifcur, in_stack_ffffffffffffffa0 != 2 &&
          (in_stack_ffffffffffffffa0 != 4)))) {
        in_RDI->tokcxlin->linflg = in_RDI->tokcxlin->linflg & 0xfffb;
        return 0;
      }
      goto LAB_0011ecfd;
    }
    in_stack_ffffffffffffffb4 = (uint)in_RDI->tokcxlen;
    local_48 = (byte *)in_RDI->tokcxptr;
    do {
      local_48 = local_48 + 1;
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 - 1;
      bVar6 = false;
      if ((in_stack_ffffffffffffffb4 != 0) &&
         (in_stack_ffffffffffffffa6 = false, bVar6 = (bool)in_stack_ffffffffffffffa6,
         *local_48 < 0x80)) {
        ppuVar5 = __ctype_b_loc();
        in_stack_ffffffffffffffa6 = ((*ppuVar5)[(int)(uint)*local_48] & 0x2000) != 0;
        bVar6 = (bool)in_stack_ffffffffffffffa6;
      }
    } while (bVar6 != false);
    tokgetlin::dirp = tokgetlin::dir;
    in_stack_ffffffffffffffa7 = 0;
    for (in_stack_ffffffffffffffb0 = 0xb; in_stack_ffffffffffffffb0 != 0;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + -1) {
      if (((tokgetlin::dirp->len <= (int)in_stack_ffffffffffffffb4) &&
          (iVar3 = memcmp(local_48,tokgetlin::dirp->nm,(long)tokgetlin::dirp->len), iVar3 == 0)) &&
         ((in_stack_ffffffffffffffb4 == tokgetlin::dirp->len ||
          ((local_48[tokgetlin::dirp->len] < 0x80 &&
           (ppuVar5 = __ctype_b_loc(),
           ((*ppuVar5)[(int)(uint)local_48[tokgetlin::dirp->len]] & 0x2000) != 0)))))) {
        in_stack_ffffffffffffffac = in_RDI->tokcxifcnt;
        if ((tokgetlin::dirp->ok_in_if != 0) ||
           (((in_stack_ffffffffffffffac == 0 ||
             (in_stack_ffffffffffffffa8 = in_RDI->tokcxifcur, in_stack_ffffffffffffffa8 == 1)) ||
            (in_stack_ffffffffffffffa8 == 3)))) {
          local_48 = local_48 + tokgetlin::dirp->len;
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 - tokgetlin::dirp->len;
          while( true ) {
            in_stack_ffffffffffffffa5 = false;
            if ((in_stack_ffffffffffffffb4 != 0) &&
               (in_stack_ffffffffffffffa4 = false,
               in_stack_ffffffffffffffa5 = in_stack_ffffffffffffffa4, *local_48 < 0x80)) {
              ppuVar5 = __ctype_b_loc();
              in_stack_ffffffffffffffa4 = ((*ppuVar5)[(int)(uint)*local_48] & 0x2000) != 0;
              in_stack_ffffffffffffffa5 = in_stack_ffffffffffffffa4;
            }
            if ((bool)in_stack_ffffffffffffffa5 == false) break;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 - 1;
            local_48 = local_48 + 1;
          }
          (*tokgetlin::dirp->fn)(in_RDI,(char *)local_48,in_stack_ffffffffffffffb4);
        }
        break;
      }
      tokgetlin::dirp = tokgetlin::dirp + 1;
    }
    if (in_stack_ffffffffffffffb0 == 0) {
      errlogf((errcxdef *)
              CONCAT17(in_stack_ffffffffffffffa7,
                       CONCAT16(in_stack_ffffffffffffffa6,
                                CONCAT15(in_stack_ffffffffffffffa5,
                                         CONCAT14(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0)))),
              in_stack_ffffffffffffff98,0);
    }
  } while( true );
}

Assistant:

static int tokgetlin(tokcxdef *ctx, int dopound)
{
    for (;;)
    {
        if (linget(ctx->tokcxlin))
        {
            /* at eof in current source; resume parent if there is one */
            if (ctx->tokcxlin->linpar)
            {
                lindef *parent;
                
                parent = ctx->tokcxlin->linpar;          /* remember parent */
                lincls(ctx->tokcxlin);               /* close included file */
                if (!ctx->tokcxdbg)               /* if no debug context... */
                    mchfre(ctx->tokcxlin);              /* free line source */
                ctx->tokcxlin = parent;      /* reset to parent line source */
                if (parent->linflg & LINFCMODE)
                    ctx->tokcxflg |= TOKCXFCMODE;
                else
                    ctx->tokcxflg &= ~TOKCXFCMODE;
                continue;                       /* back for another attempt */
            }
            else
            {
                /* check for outstanding #if/#ifdef */
                if (ctx->tokcxifcnt)
                    errlog(ctx->tokcxerr, ERR_NOENDIF);

                /* return end-of-file indication */
                return TRUE;
            }
        }
        
        /* if this is a multi-segment line, copy it into our own buffer */
        if (ctx->tokcxlin->linflg & LINFMORE)
        {
            char *p;
            uint  rem;
            int   done;
            
            if (!ctx->tokcxbuf)
            {
                /* allocate 1k as a default buffer */
                ctx->tokcxbuf = (char *)mchalo(ctx->tokcxerr, 1024,
                                               "tok");
                ctx->tokcxbsz = 1024;
            }
            ctx->tokcxlen = 0;
            
            for (done = FALSE, p = ctx->tokcxbuf, rem = ctx->tokcxbsz ;
                 !done ; )
            {
                size_t len = ctx->tokcxlin->linlen;

                /* add the current segment's length into line length */
                ctx->tokcxlen += len;
                
                /* we're done after this piece if the last fetch was all */
                done = !(ctx->tokcxlin->linflg & LINFMORE);
                if (len + 1 > rem)
                {
                    char *newp;

                    /* increase the size of the buffer */
                    if (ctx->tokcxbsz > (unsigned)0x8000)
                        errsig(ctx->tokcxerr, ERR_LONGLIN);
                    rem += 4096;
                    ctx->tokcxbsz += 4096;
                    
                    /* allocate a new buffer and copy line into it */
                    newp = (char *)mchalo(ctx->tokcxerr, ctx->tokcxbsz, "tok");
                    memcpy(newp, ctx->tokcxbuf, (size_t)(p - ctx->tokcxbuf));
                    
                    /* free the original buffer, and use the new one */
                    p = (p - ctx->tokcxbuf) + newp;
                    mchfre(ctx->tokcxbuf);
                    ctx->tokcxbuf = newp;
                }
                
                /* add the line to the buffer */
                memcpy(p, ctx->tokcxlin->linbuf, len);
                p += len;
                rem -= len;
                
                /* get the next piece of the line if there is one */
                if (!done)
                {
                    if (linget(ctx->tokcxlin)) break;
                }
            }
            
            /* null-terminate the buffer, and use it for input */
            *p = '\0';
            ctx->tokcxptr = ctx->tokcxbuf;
        }
        else
        {
            ctx->tokcxptr = ctx->tokcxlin->linbuf;
            ctx->tokcxlen = ctx->tokcxlin->linlen;
        }
        
        /* check for preprocessor directives */
        if (dopound && ctx->tokcxlen != 0 && ctx->tokcxptr[0] == '#'
            && !(ctx->tokcxlin->linflg & LINFNOINC))
        {
            char   *p;
            int     len;
            static  struct
            {
                char  *nm;
                int    len;
                int    ok_in_if;
                void (*fn)(tokcxdef *, char *, int);
            }
            *dirp, dir[] =
            {
                { "include", 7, FALSE, tokinclude },
                { "pragma",  6, FALSE, tokpragma },
                { "define",  6, FALSE, tokdefine },
                { "ifdef",   5, TRUE, tokifdef },
                { "ifndef",  6, TRUE, tokifndef },
                { "if",      2, TRUE, tokif },
                { "else",    4, TRUE, tokelse },
                { "elif",    4, TRUE, tokelif },
                { "endif",   5, TRUE, tokendif },
                { "undef",   5, FALSE, tokundef },
                { "error",   5, FALSE, tok_p_error }
            };
            int  i;

            /* scan off spaces between '#' and directive */
            for (len = ctx->tokcxlen - 1, p = &ctx->tokcxptr[1] ;
                 len && t_isspace(*p) ; --len, ++p) ;

            /* find and process the directive */
            for (dirp = dir, i = sizeof(dir)/sizeof(dir[0]) ; i ; --i, ++dirp)
            {
                /* compare this directive; if it wins, call its function */
                if (len >= dirp->len && !memcmp(p, dirp->nm, (size_t)dirp->len)
                    && (len == dirp->len || t_isspace(*(p + dirp->len))))
                {
                    int cnt;
                    int stat;
                    
                    /*
                     *   if we're not in a #if's false part, or if the
                     *   directive is processed even in #if false parts,
                     *   process the line, otherwise skip it 
                     */
                    cnt = ctx->tokcxifcnt;
                    if (dirp->ok_in_if || cnt == 0
                        || ((stat = ctx->tokcxifcur) == TOKIF_IF_YES
                            || stat == TOKIF_ELSE_YES))
                    {
                        /* skip whitespace following the directive */
                        for (p += dirp->len, len -= dirp->len ;
                             len && t_isspace(*p) ;
                             --len, ++p) ;

                        /* invoke the function to process this directive */
                        (*dirp->fn)(ctx, p, len);
                    }

                    /* there's no need to look at more directives */
                    break;
                }
            }

            /* if we didn't find anything, flag the error */
            if (i == 0)
                errlog(ctx->tokcxerr, ERR_PRPDIR);

            /* ignore this line */
            continue;
        }
        else
        {
            /*
             *   Check the #if level.  If we're in an #if, and we're to
             *   ignore lines (because of a false condition or an #else
             *   part for a true condition), skip this line. 
             */
            if (ctx->tokcxifcnt != 0)
            {
                switch(ctx->tokcxifcur)
                {
                case TOKIF_IF_NO:
                case TOKIF_ELSE_NO:
                    /* ignore this line */
                    continue;

                default:
                    /* we're in a true part - keep the line */
                    break;
                }
            }
            
            ctx->tokcxlin->linflg &= ~LINFDBG;       /* no debug record yet */
            return(FALSE);                      /* return the line we found */
        }
    }
}